

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_checksum.cpp
# Opt level: O2

uint crnlib::adler32(void *pBuf,size_t buflen,uint adler32)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  uint8 *buffer;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  
  uVar10 = (ulong)adler32 & 0xffff;
  uVar4 = (ulong)(adler32 >> 0x10);
  uVar8 = buflen % 0x15b0;
  while (buflen != 0) {
    for (uVar11 = 0; uVar11 + 7 < uVar8; uVar11 = uVar11 + 8) {
      lVar9 = uVar10 + *(byte *)((long)pBuf + uVar11);
      lVar1 = (ulong)*(byte *)((long)pBuf + uVar11 + 1) + lVar9;
      lVar5 = (ulong)*(byte *)((long)pBuf + uVar11 + 2) + lVar1;
      lVar2 = (ulong)*(byte *)((long)pBuf + uVar11 + 3) + lVar5;
      lVar6 = (ulong)*(byte *)((long)pBuf + uVar11 + 4) + lVar2;
      lVar3 = (ulong)*(byte *)((long)pBuf + uVar11 + 5) + lVar6;
      lVar7 = (ulong)*(byte *)((long)pBuf + uVar11 + 6) + lVar3;
      uVar10 = (ulong)*(byte *)((long)pBuf + uVar11 + 7) + lVar7;
      uVar4 = uVar4 + lVar9 + lVar1 + lVar5 + lVar2 + lVar6 + lVar3 + lVar7 + uVar10;
    }
    for (; uVar11 < uVar8; uVar11 = uVar11 + 1) {
      uVar10 = uVar10 + *(byte *)((long)pBuf + uVar11);
      uVar4 = uVar4 + uVar10;
    }
    uVar10 = uVar10 % 0xfff1;
    uVar4 = uVar4 % 0xfff1;
    pBuf = (void *)((long)pBuf + uVar11);
    buflen = buflen - uVar8;
    uVar8 = 0x15b0;
  }
  return (int)uVar10 + (int)uVar4 * 0x10000;
}

Assistant:

uint adler32(const void* pBuf, size_t buflen, uint adler32)
    {
        const uint8* buffer = static_cast<const uint8*>(pBuf);

        const unsigned long ADLER_MOD = 65521;
        unsigned long s1 = adler32 & 0xffff, s2 = adler32 >> 16;
        size_t blocklen;
        unsigned long i;

        blocklen = buflen % 5552;
        while (buflen)
        {
            for (i = 0; i + 7 < blocklen; i += 8)
            {
                s1 += buffer[0], s2 += s1;
                s1 += buffer[1], s2 += s1;
                s1 += buffer[2], s2 += s1;
                s1 += buffer[3], s2 += s1;
                s1 += buffer[4], s2 += s1;
                s1 += buffer[5], s2 += s1;
                s1 += buffer[6], s2 += s1;
                s1 += buffer[7], s2 += s1;

                buffer += 8;
            }

            for (; i < blocklen; ++i)
            {
                s1 += *buffer++, s2 += s1;
            }

            s1 %= ADLER_MOD, s2 %= ADLER_MOD;
            buflen -= blocklen;
            blocklen = 5552;
        }
        return (s2 << 16) + s1;
    }